

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# codeholder.cpp
# Opt level: O1

Error __thiscall
asmjit::CodeHolder::newRelocEntry(CodeHolder *this,RelocEntry **dst,uint32_t type,uint32_t size)

{
  ZoneHeap *heap;
  size_t *psVar1;
  ulong uVar2;
  Error EVar3;
  RelocEntry *pRVar4;
  size_t sStack_38;
  
  heap = &this->_baseHeap;
  EVar3 = 0;
  if ((this->_relocations).super_ZoneVectorBase._capacity ==
      (this->_relocations).super_ZoneVectorBase._length) {
    EVar3 = ZoneVectorBase::_grow(&(this->_relocations).super_ZoneVectorBase,heap,8,1);
  }
  if (EVar3 == 0) {
    uVar2 = (this->_relocations).super_ZoneVectorBase._length;
    if (uVar2 >> 0x20 == 0) {
      if (heap->_zone == (Zone *)0x0) {
        newRelocEntry();
      }
      else {
        pRVar4 = (RelocEntry *)ZoneHeap::_allocZeroed(heap,0x20,&sStack_38);
        if (pRVar4 != (RelocEntry *)0x0) {
          pRVar4->_id = (uint32_t)uVar2;
          pRVar4->_type = (uint8_t)type;
          pRVar4->_size = (uint8_t)size;
          pRVar4->_sourceSectionId = 0xffffffff;
          pRVar4->_targetSectionId = 0xffffffff;
          uVar2 = (this->_relocations).super_ZoneVectorBase._length;
          if (uVar2 < (this->_relocations).super_ZoneVectorBase._capacity) {
            *(RelocEntry **)((long)(this->_relocations).super_ZoneVectorBase._data + uVar2 * 8) =
                 pRVar4;
            psVar1 = &(this->_relocations).super_ZoneVectorBase._length;
            *psVar1 = *psVar1 + 1;
            *dst = pRVar4;
            return 0;
          }
          newRelocEntry();
        }
      }
      EVar3 = 1;
    }
    else {
      EVar3 = 0x14;
    }
  }
  return EVar3;
}

Assistant:

Error CodeHolder::newRelocEntry(RelocEntry** dst, uint32_t type, uint32_t size) noexcept {
  ASMJIT_PROPAGATE(_relocations.willGrow(&_baseHeap));

  size_t index = _relocations.getLength();
  if (ASMJIT_UNLIKELY(index > size_t(0xFFFFFFFFU)))
    return DebugUtils::errored(kErrorRelocIndexOverflow);

  RelocEntry* re = _baseHeap.allocZeroedT<RelocEntry>();
  if (ASMJIT_UNLIKELY(!re))
    return DebugUtils::errored(kErrorNoHeapMemory);

  re->_id = static_cast<uint32_t>(index);
  re->_type = static_cast<uint8_t>(type);
  re->_size = static_cast<uint8_t>(size);
  re->_sourceSectionId = SectionEntry::kInvalidId;
  re->_targetSectionId = SectionEntry::kInvalidId;
  _relocations.appendUnsafe(re);

  *dst = re;
  return kErrorOk;
}